

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_stat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *txt;
  CHAR_DATA *pCVar2;
  ROOM_INDEX_DATA *pRVar3;
  CHAR_DATA *victim;
  ROOM_INDEX_DATA *location;
  OBJ_DATA *obj;
  char *string;
  char arg [4608];
  char *in_stack_00001498;
  CHAR_DATA *in_stack_000014a0;
  char *in_stack_00002678;
  CHAR_DATA *in_stack_00002680;
  char *in_stack_00006300;
  CHAR_DATA *in_stack_00006308;
  char *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char local_1218 [4584];
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  txt = one_argument(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
  if (local_1218[0] == '\0') {
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
    send_to_char(txt,in_stack_ffffffffffffedd8);
  }
  else {
    bVar1 = str_cmp(local_1218,"room");
    if (bVar1) {
      bVar1 = str_cmp(local_1218,"area");
      if (bVar1) {
        bVar1 = str_cmp(local_1218,"obj");
        if (bVar1) {
          bVar1 = str_cmp(local_1218,"char");
          if ((bVar1) && (bVar1 = str_cmp(local_1218,"mob"), bVar1)) {
            pCVar2 = get_char_world((CHAR_DATA *)arg._4536_8_,(char *)arg._4528_8_);
            if (pCVar2 == (CHAR_DATA *)0x0) {
              pCVar2 = (CHAR_DATA *)
                       get_obj_world(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
              if (pCVar2 == (CHAR_DATA *)0x0) {
                pRVar3 = find_location((CHAR_DATA *)0x0,in_stack_ffffffffffffedd0);
                if (pRVar3 == (ROOM_INDEX_DATA *)0x0) {
                  send_to_char(txt,pCVar2);
                }
                else {
                  do_rstat(in_stack_000014a0,in_stack_00001498);
                }
              }
              else {
                do_ostat(in_stack_00002680,in_stack_00002678);
              }
            }
            else {
              do_mstat(in_stack_00006308,in_stack_00006300);
            }
          }
          else {
            do_mstat(in_stack_00006308,in_stack_00006300);
          }
        }
        else {
          do_ostat(in_stack_00002680,in_stack_00002678);
        }
      }
      else {
        do_astat((CHAR_DATA *)arg._80_8_,(char *)arg._72_8_);
      }
    }
    else {
      do_rstat(in_stack_000014a0,in_stack_00001498);
    }
  }
  return;
}

Assistant:

void do_stat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *string;
	OBJ_DATA *obj;
	ROOM_INDEX_DATA *location;
	CHAR_DATA *victim;

	string = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  stat <name>\n\r", ch);
		send_to_char("  stat obj <name>\n\r", ch);
		send_to_char("  stat mob <name>\n\r", ch);
		send_to_char("  stat room <number>\n\r", ch);
		send_to_char("  stat form <name>\n\r", ch);
		send_to_char("  stat area\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "room"))
	{
		do_rstat(ch, string);
		return;
	}

	if (!str_cmp(arg, "area"))
	{
		do_astat(ch, string);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_ostat(ch, string);
		return;
	}

	if (!str_cmp(arg, "char") || !str_cmp(arg, "mob"))
	{
		do_mstat(ch, string);
		return;
	}

	/* do it the old way */

	victim = get_char_world(ch, argument);

	if (victim != nullptr)
	{
		do_mstat(ch, argument);
		return;
	}

	obj = get_obj_world(ch, argument);

	if (obj != nullptr)
	{
		do_ostat(ch, argument);
		return;
	}

	location = find_location(ch, argument);

	if (location != nullptr)
	{
		do_rstat(ch, argument);
		return;
	}

	send_to_char("Nothing by that name found anywhere.\n\r", ch);
}